

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitTableGrow(BinaryInstWriter *this,TableGrow *curr)

{
  uint32_t value;
  BufferWithRandomAccess *pBVar1;
  U32LEB local_20;
  U32LEB local_1c;
  TableGrow *local_18;
  TableGrow *curr_local;
  BinaryInstWriter *this_local;
  
  local_18 = curr;
  curr_local = (TableGrow *)this;
  pBVar1 = BufferWithRandomAccess::operator<<(this->o,-4);
  LEB<unsigned_int,_unsigned_char>::LEB(&local_1c,0xf);
  BufferWithRandomAccess::operator<<(pBVar1,local_1c);
  pBVar1 = this->o;
  value = WasmBinaryWriter::getTableIndex(this->parent,(Name)(local_18->table).super_IString.str);
  LEB<unsigned_int,_unsigned_char>::LEB(&local_20,value);
  BufferWithRandomAccess::operator<<(pBVar1,local_20);
  return;
}

Assistant:

void BinaryInstWriter::visitTableGrow(TableGrow* curr) {
  o << int8_t(BinaryConsts::MiscPrefix) << U32LEB(BinaryConsts::TableGrow);
  o << U32LEB(parent.getTableIndex(curr->table));
}